

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

bool __thiscall
Args::CmdLine::isMisspelledName(CmdLine *this,String *name,StringList *possibleNames)

{
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar1;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  bool ret;
  undefined1 local_39;
  CmdLine *local_38;
  String *local_30;
  StringList *local_28;
  undefined1 *local_20;
  
  local_20 = &local_39;
  local_39 = 0;
  puVar1 = (this->m_args).
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  local_30 = name;
  local_28 = possibleNames;
  for (arg = (this->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; arg != puVar1; arg = arg + 1) {
    const::{lambda(auto:1_const&)#1}::operator()((_lambda_auto_1_const___1_ *)&local_38,arg);
  }
  return (bool)local_39;
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const
	{
		bool ret = false;

		std::for_each( arguments().cbegin(), arguments().cend(),
			[ & ] ( const auto & arg )
			{
				if( arg->type() == ArgType::Command )
				{
					if( arg.get() == m_command )
					{
						if( arg->isMisspelledName( name, possibleNames ) )
							ret = true;
					}
					else if( static_cast< Command* > ( arg.get() )->
						isMisspelledCommand( name, possibleNames ) )
							ret = true;
				}
				else if( arg->isMisspelledName( name, possibleNames ) )
					ret = true;
			} );

		return ret;
	}